

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O3

int __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::vSolveUpdateRight(CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    *this,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *vec,int *ridx,int n,
                   number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *eps)

{
  uint *puVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  bool bVar5;
  uint uVar6;
  long lVar7;
  cpp_dec_float<50U,_int,_void> *v;
  cpp_dec_float<50U,_int,_void> *pcVar8;
  long lVar9;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar10;
  int *piVar11;
  undefined8 uVar12;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  cpp_dec_float<50U,_int,_void> local_1b8;
  cpp_dec_float<50U,_int,_void> local_178;
  int local_13c;
  uint local_138;
  int local_134;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_130;
  cpp_dec_float<50U,_int,_void> local_128;
  int *local_e8;
  pointer local_e0;
  int *local_d8;
  int *local_d0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_c8;
  long local_c0;
  int *local_b8;
  long local_b0;
  cpp_dec_float<50U,_int,_void> local_a8;
  cpp_dec_float<50U,_int,_void> local_68;
  
  local_178.fpclass = cpp_dec_float_finite;
  local_178.prec_elem = 10;
  local_178.data._M_elems[0] = 0;
  local_178.data._M_elems[1] = 0;
  local_178.data._M_elems[2] = 0;
  local_178.data._M_elems[3] = 0;
  local_178.data._M_elems[4] = 0;
  local_178.data._M_elems[5] = 0;
  local_178.data._M_elems._24_5_ = 0;
  local_178.data._M_elems[7]._1_3_ = 0;
  local_178.data._M_elems._32_5_ = 0;
  local_178.data._M_elems[9]._1_3_ = 0;
  local_178.exp = 0;
  local_178.neg = false;
  local_13c = (this->l).firstUnused;
  iVar3 = (this->l).firstUpdate;
  lVar9 = (long)iVar3;
  if (iVar3 < local_13c) {
    local_e0 = (this->l).val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    local_e8 = (this->l).idx;
    local_d0 = (this->l).row;
    local_d8 = (this->l).start;
    local_130 = vec;
    local_c8 = eps;
    local_b8 = ridx;
    do {
      iVar3 = local_d0[lVar9];
      local_128.data._M_elems._32_8_ = *(undefined8 *)(vec[iVar3].m_backend.data._M_elems + 8);
      local_128.data._M_elems._0_8_ = *(undefined8 *)vec[iVar3].m_backend.data._M_elems;
      local_128.data._M_elems._8_8_ = *(undefined8 *)(vec[iVar3].m_backend.data._M_elems + 2);
      puVar1 = vec[iVar3].m_backend.data._M_elems + 4;
      local_128.data._M_elems._16_8_ = *(undefined8 *)puVar1;
      local_128.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
      local_1b8.exp = vec[iVar3].m_backend.exp;
      local_128.neg = vec[iVar3].m_backend.neg;
      local_128.fpclass = vec[iVar3].m_backend.fpclass;
      local_128.prec_elem = vec[iVar3].m_backend.prec_elem;
      uVar12 = *(undefined8 *)(vec[iVar3].m_backend.data._M_elems + 8);
      local_1b8.data._M_elems._32_5_ = SUB85(uVar12,0);
      local_1b8.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar12 >> 0x28);
      local_1b8.data._M_elems._0_8_ = *(undefined8 *)vec[iVar3].m_backend.data._M_elems;
      local_1b8.data._M_elems._8_8_ = *(undefined8 *)(vec[iVar3].m_backend.data._M_elems + 2);
      puVar1 = vec[iVar3].m_backend.data._M_elems + 4;
      local_1b8.data._M_elems._16_8_ = *(undefined8 *)puVar1;
      uVar12 = *(undefined8 *)(puVar1 + 2);
      local_1b8.data._M_elems._24_5_ = SUB85(uVar12,0);
      local_1b8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar12 >> 0x28);
      local_68.data._M_elems._0_8_ = *(undefined8 *)(local_c8->m_backend).data._M_elems;
      local_68.data._M_elems._8_8_ = *(undefined8 *)((local_c8->m_backend).data._M_elems + 2);
      local_68.data._M_elems._16_8_ = *(undefined8 *)((local_c8->m_backend).data._M_elems + 4);
      local_68.data._M_elems._24_8_ = *(undefined8 *)((local_c8->m_backend).data._M_elems + 6);
      local_68.data._M_elems._32_8_ = *(undefined8 *)((local_c8->m_backend).data._M_elems + 8);
      local_68.exp = (local_c8->m_backend).exp;
      local_68.neg = (local_c8->m_backend).neg;
      local_68.fpclass = (local_c8->m_backend).fpclass;
      local_68.prec_elem = (local_c8->m_backend).prec_elem;
      local_1b8.prec_elem = local_128.prec_elem;
      local_1b8.fpclass = local_128.fpclass;
      local_1b8.neg = local_128.neg;
      if ((local_128.neg == true) &&
         (local_1b8.data._M_elems[0] != 0 || local_128.fpclass != cpp_dec_float_finite)) {
        local_1b8.neg = false;
      }
      local_c0 = lVar9;
      if ((local_68.fpclass != cpp_dec_float_NaN && local_128.fpclass != cpp_dec_float_NaN) &&
         (local_128.exp = local_1b8.exp,
         iVar3 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                           (&local_1b8,&local_68), 0 < iVar3)) {
        lVar7 = (long)local_d8[lVar9];
        iVar3 = local_d8[lVar9 + 1];
        if (local_d8[lVar9] < iVar3) {
          pcVar8 = &local_e0[lVar7].m_backend;
          piVar11 = local_e8 + lVar7;
          local_b0 = lVar7;
          do {
            iVar2 = *piVar11;
            local_b8[n] = iVar2;
            local_178.data._M_elems._32_8_ = *(undefined8 *)(vec[iVar2].m_backend.data._M_elems + 8)
            ;
            local_178.data._M_elems._0_8_ = *(undefined8 *)vec[iVar2].m_backend.data._M_elems;
            local_178.data._M_elems._8_8_ = *(undefined8 *)(vec[iVar2].m_backend.data._M_elems + 2);
            puVar1 = vec[iVar2].m_backend.data._M_elems + 4;
            local_178.data._M_elems._16_8_ = *(undefined8 *)puVar1;
            uVar12 = *(undefined8 *)(puVar1 + 2);
            local_178.data._M_elems._24_5_ = SUB85(uVar12,0);
            local_178.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar12 >> 0x28);
            local_178.exp = vec[iVar2].m_backend.exp;
            local_178.neg = vec[iVar2].m_backend.neg;
            local_178.fpclass = vec[iVar2].m_backend.fpclass;
            local_178.prec_elem = vec[iVar2].m_backend.prec_elem;
            uVar6 = 0;
            local_134 = n;
            if (local_178.fpclass != cpp_dec_float_NaN) {
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
              cpp_dec_float<long_long>(&local_1b8,0,(type *)0x0);
              iVar4 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                (&local_178,&local_1b8);
              uVar6 = (uint)(iVar4 == 0);
            }
            local_a8.fpclass = cpp_dec_float_finite;
            local_a8.prec_elem = 10;
            local_a8.data._M_elems[0] = 0;
            local_a8.data._M_elems[1] = 0;
            local_a8.data._M_elems[2] = 0;
            local_a8.data._M_elems[3] = 0;
            local_a8.data._M_elems[4] = 0;
            local_a8.data._M_elems[5] = 0;
            local_a8.data._M_elems._24_5_ = 0;
            local_a8.data._M_elems[7]._1_3_ = 0;
            local_a8.data._M_elems._32_5_ = 0;
            local_a8.data._M_elems[9]._1_3_ = 0;
            local_a8.exp = 0;
            local_a8.neg = false;
            v = &local_128;
            if (pcVar8 != &local_a8) {
              local_a8.data._M_elems._32_5_ = local_128.data._M_elems._32_5_;
              local_a8.data._M_elems[9]._1_3_ = local_128.data._M_elems[9]._1_3_;
              local_a8.data._M_elems[4] = local_128.data._M_elems[4];
              local_a8.data._M_elems[5] = local_128.data._M_elems[5];
              local_a8.data._M_elems._24_5_ = local_128.data._M_elems._24_5_;
              local_a8.data._M_elems[7]._1_3_ = local_128.data._M_elems[7]._1_3_;
              local_a8.data._M_elems[0] = local_128.data._M_elems[0];
              local_a8.data._M_elems[1] = local_128.data._M_elems[1];
              local_a8.data._M_elems[2] = local_128.data._M_elems[2];
              local_a8.data._M_elems[3] = local_128.data._M_elems[3];
              local_a8.exp = local_128.exp;
              local_a8.neg = local_128.neg;
              local_a8.prec_elem = local_128.prec_elem;
              local_a8.fpclass = local_128.fpclass;
              v = pcVar8;
            }
            local_138 = uVar6;
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=(&local_a8,v);
            local_1b8.data._M_elems[0] = local_178.data._M_elems[0];
            local_1b8.data._M_elems[1] = local_178.data._M_elems[1];
            local_1b8.data._M_elems[2] = local_178.data._M_elems[2];
            local_1b8.data._M_elems[3] = local_178.data._M_elems[3];
            local_1b8.data._M_elems[4] = local_178.data._M_elems[4];
            local_1b8.data._M_elems[5] = local_178.data._M_elems[5];
            local_1b8.data._M_elems._24_5_ = local_178.data._M_elems._24_5_;
            local_1b8.data._M_elems[7]._1_3_ = local_178.data._M_elems[7]._1_3_;
            local_1b8.data._M_elems._32_5_ = local_178.data._M_elems._32_5_;
            local_1b8.data._M_elems[9]._1_3_ = local_178.data._M_elems[9]._1_3_;
            local_1b8.exp = local_178.exp;
            local_1b8.neg = local_178.neg;
            local_1b8.fpclass = local_178.fpclass;
            local_1b8.prec_elem = local_178.prec_elem;
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                      (&local_1b8,&local_a8);
            local_178.data._M_elems[0] = local_1b8.data._M_elems[0];
            local_178.data._M_elems[1] = local_1b8.data._M_elems[1];
            local_178.data._M_elems[2] = local_1b8.data._M_elems[2];
            local_178.data._M_elems[3] = local_1b8.data._M_elems[3];
            local_178.data._M_elems[4] = local_1b8.data._M_elems[4];
            local_178.data._M_elems[5] = local_1b8.data._M_elems[5];
            local_178.data._M_elems._24_5_ = local_1b8.data._M_elems._24_5_;
            local_178.data._M_elems[7]._1_3_ = local_1b8.data._M_elems[7]._1_3_;
            local_178.data._M_elems._32_5_ = local_1b8.data._M_elems._32_5_;
            local_178.data._M_elems[9]._1_3_ = local_1b8.data._M_elems[9]._1_3_;
            local_178.exp = local_1b8.exp;
            local_178.neg = local_1b8.neg;
            local_178.fpclass = local_1b8.fpclass;
            local_178.prec_elem = local_1b8.prec_elem;
            if (local_1b8.fpclass == cpp_dec_float_NaN) {
              uVar12._4_4_ = local_1b8.prec_elem;
              uVar12._0_4_ = cpp_dec_float_NaN;
LAB_002ac59d:
              local_1b8.data._M_elems._32_5_ = local_178.data._M_elems._32_5_;
              local_1b8.data._M_elems[9]._1_3_ = local_178.data._M_elems[9]._1_3_;
              local_1b8.data._M_elems[4] = local_178.data._M_elems[4];
              local_1b8.data._M_elems[5] = local_178.data._M_elems[5];
              local_1b8.data._M_elems._24_5_ = local_178.data._M_elems._24_5_;
              local_1b8.data._M_elems[7]._1_3_ = local_178.data._M_elems[7]._1_3_;
              local_1b8.data._M_elems[0] = local_178.data._M_elems[0];
              local_1b8.data._M_elems[1] = local_178.data._M_elems[1];
              local_1b8.data._M_elems[2] = local_178.data._M_elems[2];
              local_1b8.data._M_elems[3] = local_178.data._M_elems[3];
              vec = local_130;
              iVar4 = local_178.exp;
              bVar5 = local_178.neg;
            }
            else {
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
              cpp_dec_float<long_long>(&local_1b8,0,(type *)0x0);
              iVar4 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                (&local_178,&local_1b8);
              vec = local_130;
              uVar12 = local_178._48_8_;
              if (iVar4 != 0) goto LAB_002ac59d;
              local_1b8.fpclass = cpp_dec_float_finite;
              local_1b8.prec_elem = 10;
              local_1b8.data._M_elems[0] = 0;
              local_1b8.data._M_elems[1] = 0;
              local_1b8.data._M_elems[2] = 0;
              local_1b8.data._M_elems[3] = 0;
              local_1b8.data._M_elems[4] = 0;
              local_1b8.data._M_elems[5] = 0;
              local_1b8.data._M_elems._24_5_ = 0;
              local_1b8.data._M_elems[7]._1_3_ = 0;
              local_1b8.data._M_elems._32_5_ = 0;
              local_1b8.data._M_elems[9]._1_3_ = 0;
              local_1b8.exp = 0;
              local_1b8.neg = false;
              boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                        ((cpp_dec_float<50u,int,void> *)&local_1b8,1e-100);
              iVar4 = local_1b8.exp;
              bVar5 = local_1b8.neg;
              uVar12 = local_1b8._48_8_;
            }
            piVar11 = piVar11 + 1;
            pnVar10 = vec + iVar2;
            n = local_134 + local_138;
            pcVar8 = pcVar8 + 1;
            *(ulong *)((pnVar10->m_backend).data._M_elems + 8) =
                 CONCAT35(local_1b8.data._M_elems[9]._1_3_,local_1b8.data._M_elems._32_5_);
            *(undefined8 *)((pnVar10->m_backend).data._M_elems + 4) = local_1b8.data._M_elems._16_8_
            ;
            *(ulong *)((pnVar10->m_backend).data._M_elems + 6) =
                 CONCAT35(local_1b8.data._M_elems[7]._1_3_,local_1b8.data._M_elems._24_5_);
            *(undefined8 *)(pnVar10->m_backend).data._M_elems = local_1b8.data._M_elems._0_8_;
            *(undefined8 *)((pnVar10->m_backend).data._M_elems + 2) = local_1b8.data._M_elems._8_8_;
            (pnVar10->m_backend).exp = iVar4;
            (pnVar10->m_backend).neg = bVar5;
            (pnVar10->m_backend).fpclass = (fpclass_type)uVar12;
            (pnVar10->m_backend).prec_elem = SUB84(uVar12,4);
            iVar3 = iVar3 + -1;
          } while ((int)local_b0 < iVar3);
        }
      }
      lVar9 = local_c0 + 1;
    } while (local_13c != (int)lVar9);
  }
  return n;
}

Assistant:

int CLUFactor<R>::vSolveUpdateRight(R* vec, int* ridx, int n, R eps)
{
   int i, j, k;
   int end;
   R x, y;
   R* lval, *val;
   int* lrow, *lidx, *idx;
   int* lbeg;

   assert(!l.updateType);               /* no Forest-Tomlin Updates */

   lval = l.val.data();
   lidx = l.idx;
   lrow = l.row;
   lbeg = l.start;
   end = l.firstUnused;

   for(i = l.firstUpdate; i < end; ++i)
   {
      assert(i >= 0 && i < thedim);
      x = vec[lrow[i]];

      if(isNotZero(x, eps))
      {
         k = lbeg[i];
         assert(k >= 0 && k < l.size);
         idx = &(lidx[k]);
         val = &(lval[k]);

         for(j = lbeg[i + 1]; j > k; --j)
         {
            int m = ridx[n] = *idx++;
            assert(m >= 0 && m < thedim);
            y = vec[m];
            n += (y == 0) ? 1 : 0;
            y = y - x * (*val++);
            vec[m] = (y != 0) ? y : SOPLEX_FACTOR_MARKER;
         }
      }
   }

   return n;
}